

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * cmOutputConverter::EscapeForCMake(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  char *pcVar2;
  allocator local_29;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"\"",&local_29);
  pcVar2 = (str->_M_dataplus)._M_p;
  do {
    cVar1 = *pcVar2;
    if (((cVar1 == '\"') || (cVar1 == '$')) || (cVar1 == '\\')) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      if (cVar1 == '\0') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

std::string cmOutputConverter::EscapeForCMake(const std::string& str)
{
  // Always double-quote the argument to take care of most escapes.
  std::string result = "\"";
  for (const char* c = str.c_str(); *c; ++c) {
    if (*c == '"') {
      // Escape the double quote to avoid ending the argument.
      result += "\\\"";
    } else if (*c == '$') {
      // Escape the dollar to avoid expanding variables.
      result += "\\$";
    } else if (*c == '\\') {
      // Escape the backslash to avoid other escapes.
      result += "\\\\";
    } else {
      // Other characters will be parsed correctly.
      result += *c;
    }
  }
  result += "\"";
  return result;
}